

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

xml_attribute __thiscall
NULLCPugiXML::xml_node__insert_attribute_before
          (NULLCPugiXML *this,NULLCArray name,xml_attribute *attr,xml_node *ptr)

{
  xml_attribute local_20;
  
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty",name.ptr);
    local_20._attr = (xml_attribute_struct *)0x0;
    pugi::xml_attribute::xml_attribute(&local_20);
  }
  else {
    pugi::xml_attribute::xml_attribute(&local_20);
    local_20 = pugi::xml_node::insert_attribute_before
                         ((xml_node *)attr,(char_t *)this,
                          (xml_attribute *)
                          CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len));
  }
  return (xml_attribute)local_20._attr;
}

Assistant:

xml_attribute xml_node__insert_attribute_before(NULLCArray name, xml_attribute* attr, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_attribute();
		}
		xml_attribute ret;
		ret.attribute = ptr->node.insert_attribute_before(name.ptr, attr->attribute);
		return ret;
	}